

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast16.c
# Opt level: O0

void arrangeQuoters_superFast_lessThen5
               (word *pInOut,int start,int iQ,int jQ,int kQ,int lQ,int iVar,int nWords,
               char *pCanonPerm,uint *pCanonPhase)

{
  byte bVar1;
  int iVar2;
  int local_28;
  int blockSize;
  int i;
  int lQ_local;
  int kQ_local;
  int jQ_local;
  int iQ_local;
  int start_local;
  word *pInOut_local;
  
  iVar2 = 1 << ((byte)iVar & 0x1f);
  local_28 = start;
  while( true ) {
    if (local_28 < 0) {
      updataInfo(iQ,jQ,iVar,pCanonPerm,pCanonPhase);
      return;
    }
    if (0x3f < iQ * iVar2) {
      __assert_fail("iQ*blockSize < 64",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/lucky/luckyFast16.c"
                    ,0x6c,
                    "void arrangeQuoters_superFast_lessThen5(word *, int, int, int, int, int, int, int, char *, unsigned int *)"
                   );
    }
    if (0x3f < jQ * iVar2) {
      __assert_fail("jQ*blockSize < 64",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/lucky/luckyFast16.c"
                    ,0x6d,
                    "void arrangeQuoters_superFast_lessThen5(word *, int, int, int, int, int, int, int, char *, unsigned int *)"
                   );
    }
    if (0x3f < kQ * iVar2) break;
    if (0x3f < lQ * iVar2) {
      __assert_fail("lQ*blockSize < 64",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/lucky/luckyFast16.c"
                    ,0x6f,
                    "void arrangeQuoters_superFast_lessThen5(word *, int, int, int, int, int, int, int, char *, unsigned int *)"
                   );
    }
    if (0x3f < iVar2 * 3) {
      __assert_fail("3*blockSize < 64",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/lucky/luckyFast16.c"
                    ,0x70,
                    "void arrangeQuoters_superFast_lessThen5(word *, int, int, int, int, int, int, int, char *, unsigned int *)"
                   );
    }
    bVar1 = (byte)iVar2;
    pInOut[local_28] =
         (pInOut[local_28] & SFmask[iVar][iQ]) << ((char)iQ * bVar1 & 0x3f) |
         ((pInOut[local_28] & SFmask[iVar][jQ]) << ((char)jQ * bVar1 & 0x3f)) >> (bVar1 & 0x3f) |
         ((pInOut[local_28] & SFmask[iVar][kQ]) << ((char)kQ * bVar1 & 0x3f)) >>
         ((byte)(iVar2 << 1) & 0x3f) |
         ((pInOut[local_28] & SFmask[iVar][lQ]) << ((char)lQ * bVar1 & 0x3f)) >>
         (bVar1 * '\x03' & 0x3f);
    local_28 = local_28 + -1;
  }
  __assert_fail("kQ*blockSize < 64",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/lucky/luckyFast16.c"
                ,0x6e,
                "void arrangeQuoters_superFast_lessThen5(word *, int, int, int, int, int, int, int, char *, unsigned int *)"
               );
}

Assistant:

void arrangeQuoters_superFast_lessThen5(word* pInOut, int start, int iQ, int jQ, int kQ, int lQ, int iVar, int nWords, char * pCanonPerm, unsigned* pCanonPhase)
{
    int i, blockSize = 1<<iVar;
//     printf("in arrangeQuoters_superFast_lessThen5\n");
//     printf("start = %d, iQ = %d,jQ = %d,kQ = %d,lQ = %d, iVar = %d, nWords = %d\n", start, iQ, jQ, kQ , lQ, iVar, nWords);
    for(i=start;i>=0;i--)
    {   
        assert( iQ*blockSize < 64 );
        assert( jQ*blockSize < 64 );
        assert( kQ*blockSize < 64 );
        assert( lQ*blockSize < 64 );
        assert( 3*blockSize < 64 );
        pInOut[i] = (pInOut[i] & SFmask[iVar][iQ])<<(iQ*blockSize) |
            (((pInOut[i] & SFmask[iVar][jQ])<<(jQ*blockSize))>>blockSize) |
            (((pInOut[i] & SFmask[iVar][kQ])<<(kQ*blockSize))>>2*blockSize) |
            (((pInOut[i] & SFmask[iVar][lQ])<<(lQ*blockSize))>>3*blockSize);
    }
    updataInfo(iQ, jQ, iVar, pCanonPerm, pCanonPhase);
//     printf("out arrangeQuoters_superFast_lessThen5\n");

}